

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

bool __thiscall
wasm::ValidationInfo::shouldBeFalse<wasm::Name>
          (ValidationInfo *this,bool result,Name curr,char *text,Function *func)

{
  Name curr_00;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Function *local_40;
  Function *func_local;
  char *text_local;
  ValidationInfo *pVStack_28;
  bool result_local;
  ValidationInfo *this_local;
  Name curr_local;
  
  curr_local.super_IString.str._M_len = curr.super_IString.str._M_str;
  this_local = curr.super_IString.str._M_len;
  if (result) {
    local_40 = func;
    func_local = (Function *)text;
    text_local._7_1_ = result;
    pVStack_28 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,text,&local_81);
    std::operator+(&local_60,"unexpected true: ",&local_80);
    curr_00.super_IString.str._M_str = (char *)curr_local.super_IString.str._M_len;
    curr_00.super_IString.str._M_len = (size_t)this_local;
    fail<wasm::Name,std::__cxx11::string>(this,&local_60,curr_00,local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return !result;
}

Assistant:

bool shouldBeFalse(bool result,
                     T curr,
                     const char* text,
                     Function* func = nullptr) {
    if (result) {
      fail("unexpected true: " + std::string(text), curr, func);
      return false;
    }
    return true;
  }